

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O2

void __thiscall wasm::ConstHoisting::visitFunction(ConstHoisting *this,Function *curr)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  Function *pFVar3;
  bool bVar4;
  Block *pBVar5;
  _List_node_base *p_Var6;
  Literal local_80;
  _List_node_base *local_68;
  Function *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> prelude;
  Builder local_38;
  Builder builder;
  
  auStack_58 = (undefined1  [8])0x0;
  prelude.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  prelude.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var6 = (_List_node_base *)&(this->uses).List;
  local_68 = p_Var6;
  local_60 = curr;
  while (p_Var6 = (((_List_base<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>,_std::allocator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>_>
                     *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != local_68) {
    p_Var1 = p_Var6[2]._M_prev;
    p_Var2 = p_Var6[3]._M_next;
    Literal::Literal(&local_80,(Literal *)(p_Var6 + 1));
    bVar4 = worthHoisting(this,&local_80,(Index)((ulong)((long)p_Var2 - (long)p_Var1) >> 3));
    Literal::~Literal(&local_80);
    if (bVar4) {
      local_38.wasm =
           (Module *)
           hoist(this,(vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                      &p_Var6[2]._M_prev);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,
                 (Expression **)&local_38);
    }
  }
  if (auStack_58 !=
      (undefined1  [8])
      prelude.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>_>
         ).super_PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>.
         super_Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>.currModule;
    pBVar5 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       (&local_38,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_58);
    pFVar3 = local_60;
    pBVar5 = Builder::makeSequence(&local_38,(Expression *)pBVar5,local_60->body);
    pFVar3->body = (Expression *)pBVar5;
  }
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58);
  return;
}

Assistant:

void visitFunction(Function* curr) {
    std::vector<Expression*> prelude;
    for (auto& [value, vec] : uses) {
      auto num = vec.size();
      if (worthHoisting(value, num)) {
        prelude.push_back(hoist(vec));
      }
    }
    if (!prelude.empty()) {
      Builder builder(*getModule());
      // merge-blocks can optimize this into a single block later in most cases
      curr->body = builder.makeSequence(builder.makeBlock(prelude), curr->body);
    }
  }